

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::MultiVertexArrayOutputTests::addInputTypeCases
          (MultiVertexArrayOutputTests *this,Spec *spec,int depth)

{
  InputType type;
  TestContext *testCtx;
  GLValue min_;
  GLValue max_;
  MultiVertexArrayTest *this_00;
  RenderContext *renderCtx;
  char *name_00;
  char *desc_00;
  GLValue GVar1;
  GLValue GVar2;
  Spec local_140;
  undefined1 local_118 [8];
  Spec _spec;
  undefined4 uStack_dc;
  undefined1 local_d0 [8];
  ArraySpec arraySpec;
  InputType IStack_88;
  int inputTypeNdx;
  InputType inputTypes [5];
  undefined1 local_60 [8];
  string desc;
  string name;
  int depth_local;
  Spec *spec_local;
  MultiVertexArrayOutputTests *this_local;
  
  if (depth == 0) {
    getTestName_abi_cxx11_((string *)((long)&desc.field_2 + 8),this,spec);
    getTestName_abi_cxx11_((string *)local_60,this,spec);
    this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
    testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    renderCtx = Context::getRenderContext((this->super_TestCaseGroup).m_context);
    name_00 = (char *)std::__cxx11::string::c_str();
    desc_00 = (char *)std::__cxx11::string::c_str();
    deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
              (this_00,testCtx,renderCtx,spec,name_00,desc_00);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string((string *)(desc.field_2._M_local_buf + 8));
  }
  else {
    _IStack_88 = 0x300000001;
    inputTypes[0] = INPUTTYPE_SHORT;
    inputTypes[1] = INPUTTYPE_UNSIGNED_BYTE;
    inputTypes[2] = INPUTTYPE_UNSIGNED_SHORT;
    for (arraySpec.max.field_1._4_4_ = 0; (int)arraySpec.max.field_1._4_4_ < 5;
        arraySpec.max.field_1._4_4_ = arraySpec.max.field_1._4_4_ + 1) {
      type = (&IStack_88)[(int)arraySpec.max.field_1._4_4_];
      GVar1 = deqp::gls::GLValue::getMinValue(type);
      GVar2 = deqp::gls::GLValue::getMaxValue((&IStack_88)[(int)arraySpec.max.field_1._4_4_]);
      _spec.arrays.
      super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = GVar2.type;
      max_._4_4_ = _spec.arrays.
                   super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      max_.type = (InputType)
                  _spec.arrays.
                  super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      min_._4_4_ = uStack_dc;
      min_.type = GVar1.type;
      min_.field_1 = GVar1.field_1;
      max_.field_1 = GVar2.field_1;
      deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                ((ArraySpec *)local_d0,type,OUTPUTTYPE_VEC2,STORAGE_USER,USAGE_DYNAMIC_DRAW,2,0,0,
                 false,min_,max_);
      deqp::gls::MultiVertexArrayTest::Spec::Spec((Spec *)local_118,spec);
      std::
      vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
      ::push_back((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                   *)&_spec.first,(ArraySpec *)local_d0);
      deqp::gls::MultiVertexArrayTest::Spec::Spec(&local_140,(Spec *)local_118);
      addInputTypeCases(this,&local_140,depth + -1);
      deqp::gls::MultiVertexArrayTest::Spec::~Spec(&local_140);
      deqp::gls::MultiVertexArrayTest::Spec::~Spec((Spec *)local_118);
    }
  }
  return;
}

Assistant:

void MultiVertexArrayOutputTests::addInputTypeCases (MultiVertexArrayTest::Spec spec, int depth)
{
	if (depth == 0)
	{
		std::string name = getTestName(spec);
		std::string desc = getTestName(spec);
		addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), desc.c_str()));
		return;
	}

	Array::InputType inputTypes[] = {Array::INPUTTYPE_FIXED, Array::INPUTTYPE_BYTE, Array::INPUTTYPE_SHORT, Array::INPUTTYPE_UNSIGNED_BYTE, Array::INPUTTYPE_UNSIGNED_SHORT};
	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		MultiVertexArrayTest::Spec::ArraySpec arraySpec(inputTypes[inputTypeNdx],
														Array::OUTPUTTYPE_VEC2,
														Array::STORAGE_USER,
														Array::USAGE_DYNAMIC_DRAW,
														2,
														0,
														0,
														false,
														GLValue::getMinValue(inputTypes[inputTypeNdx]),
														GLValue::getMaxValue(inputTypes[inputTypeNdx]));

		MultiVertexArrayTest::Spec _spec = spec;
		_spec.arrays.push_back(arraySpec);
		addInputTypeCases(_spec, depth-1);
	}
}